

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

size_t __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::ProducerBase::size_approx(ProducerBase *this)

{
  unsigned_long b;
  unsigned_long a;
  bool bVar1;
  long in_RDI;
  __int_type head;
  __int_type tail;
  memory_order __b_1;
  memory_order __b;
  undefined8 local_78;
  
  std::operator&(relaxed,__memory_order_mask);
  b = *(unsigned_long *)(in_RDI + 0x20);
  std::operator&(relaxed,__memory_order_mask);
  a = *(unsigned_long *)(in_RDI + 0x28);
  bVar1 = details::circular_less_than<unsigned_long>(a,b);
  if (bVar1) {
    local_78 = b - a;
  }
  else {
    local_78 = 0;
  }
  return local_78;
}

Assistant:

inline size_t size_approx() const {
      auto tail = tailIndex.load(std::memory_order_relaxed);
      auto head = headIndex.load(std::memory_order_relaxed);
      return details::circular_less_than(head, tail)
                 ? static_cast<size_t>(tail - head)
                 : 0;
    }